

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.cpp
# Opt level: O2

string * __thiscall
crawler::TokenQueue::consumeElementSelector_abi_cxx11_
          (string *__return_storage_ptr__,TokenQueue *this)

{
  string *psVar1;
  bool bVar2;
  size_t sVar3;
  allocator<char> local_c4;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  size_t local_c0;
  string *local_b8;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  sVar3 = this->pos;
  local_c0 = sVar3;
  local_b8 = __return_storage_ptr__;
  while (sVar3 < (this->data)._M_string_length) {
    bVar2 = matchesWords(this);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>(local_b0,"*|",&local_c1);
      std::__cxx11::string::string<std::allocator<char>>(local_90,"|",&local_c2);
      std::__cxx11::string::string<std::allocator<char>>(local_70,"_",&local_c3);
      std::__cxx11::string::string<std::allocator<char>>(local_50,"-",&local_c4);
      bVar2 = matchesAny<4ul>(this,(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                                    *)local_b0);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
              *)local_b0);
      sVar3 = this->pos;
      if (!bVar2) break;
    }
    sVar3 = sVar3 + 1;
    this->pos = sVar3;
  }
  psVar1 = local_b8;
  std::__cxx11::string::substr((ulong)local_b8,(ulong)this);
  return psVar1;
}

Assistant:

std::string crawler::TokenQueue::consumeElementSelector() {
  return consumeByPredicate([this]() -> bool {
    return matchesAny(std::array<std::string, 4>({"*|", "|", "_", "-"}));
  });
}